

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warp.cpp
# Opt level: O0

void Handlers::Warp_Accept(Character *character,PacketReader *reader)

{
  pointer *this;
  pointer *this_00;
  WarpAnimation WVar1;
  NPC *pNVar2;
  bool bVar3;
  int num;
  list<Character_*,_std::allocator<Character_*>_> *this_01;
  reference ppCVar4;
  vector<NPC_*,_std::allocator<NPC_*>_> *this_02;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *this_03;
  reference psVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  reference ppCVar9;
  reference ppNVar10;
  reference psVar11;
  element_type *peVar12;
  undefined1 local_1b8 [8];
  shared_ptr<Map_Item> item_1;
  iterator __end1_5;
  iterator __begin1_5;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1_5;
  NPC *npc_1;
  iterator __end1_4;
  iterator __begin1_4;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1_4;
  string local_150;
  Character *local_130;
  Character *character_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<Character_*,_std::allocator<Character_*>_> *__range1_3;
  PacketBuilder reply;
  shared_ptr<Map_Item> item;
  iterator __end1_2;
  iterator __begin1_2;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1_2;
  NPC *npc;
  iterator __end1_1;
  iterator __begin1_1;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1_1;
  Character *local_88;
  Character *checkcharacter;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> updateitems;
  vector<NPC_*,_std::allocator<NPC_*>_> updatenpcs;
  vector<Character_*,_std::allocator<Character_*>_> updatecharacters;
  int anim;
  PacketReader *reader_local;
  Character *character_local;
  
  WVar1 = character->warp_anim;
  if (WVar1 != 0xff) {
    character->warp_anim = WARP_ANIMATION_INVALID;
    std::vector<Character_*,_std::allocator<Character_*>_>::vector
              ((vector<Character_*,_std::allocator<Character_*>_> *)
               &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<NPC_*,_std::allocator<NPC_*>_>::vector
              ((vector<NPC_*,_std::allocator<NPC_*>_> *)
               &updateitems.
                super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::vector
              ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
               &__range1);
    this_01 = &character->map->characters;
    __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_01);
    checkcharacter =
         (Character *)std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_01);
    while (bVar3 = std::operator!=(&__end1,(_Self *)&checkcharacter), bVar3) {
      ppCVar4 = std::_List_iterator<Character_*>::operator*(&__end1);
      local_88 = *ppCVar4;
      bVar3 = Character::InRange(local_88,character);
      if (bVar3) {
        std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                  ((vector<Character_*,_std::allocator<Character_*>_> *)
                   &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_88);
      }
      std::_List_iterator<Character_*>::operator++(&__end1);
    }
    this_02 = &character->map->npcs;
    __end1_1 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(this_02);
    npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(this_02);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                               *)&npc), bVar3) {
      ppNVar10 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                 operator*(&__end1_1);
      __range1_2 = (list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                   *ppNVar10;
      bVar3 = Character::InRange(character,(NPC *)__range1_2);
      if ((bVar3) &&
         (((__range1_2->
           super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>)
           ._M_impl._M_node._M_size & 1) != 0)) {
        std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back
                  ((vector<NPC_*,_std::allocator<NPC_*>_> *)
                   &updateitems.
                    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&__range1_2);
      }
      __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
                (&__end1_1);
    }
    this_03 = &character->map->items;
    __end1_2 = std::__cxx11::
               list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::begin
                         (this_03);
    item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
         ::end(this_03);
    while (bVar3 = std::operator!=(&__end1_2,
                                   (_Self *)&item.
                                             super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount), bVar3) {
      psVar5 = std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&__end1_2);
      std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)&reply.add_size,psVar5);
      peVar12 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&reply.add_size);
      bVar3 = Character::InRange(character,peVar12);
      if (bVar3) {
        std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
        push_back((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                  &__range1,(value_type *)&reply.add_size);
      }
      std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)&reply.add_size);
      std::_List_iterator<std::shared_ptr<Map_Item>_>::operator++(&__end1_2);
    }
    sVar6 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                      ((vector<Character_*,_std::allocator<Character_*>_> *)
                       &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    sVar7 = std::vector<NPC_*,_std::allocator<NPC_*>_>::size
                      ((vector<NPC_*,_std::allocator<NPC_*>_> *)
                       &updateitems.
                        super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar8 = std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
            size((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                 &__range1);
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)&__range1_3,PACKET_WARP,PACKET_AGREE,
               sVar6 * 0x3c + sVar7 * 6 + 7 + sVar8 * 9);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,2);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)character->mapid);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)WVar1);
    sVar6 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                      ((vector<Character_*,_std::allocator<Character_*>_> *)
                       &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(int)sVar6);
    PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
    this = &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    __end1_3 = std::vector<Character_*,_std::allocator<Character_*>_>::begin
                         ((vector<Character_*,_std::allocator<Character_*>_> *)this);
    character_1 = (Character *)
                  std::vector<Character_*,_std::allocator<Character_*>_>::end
                            ((vector<Character_*,_std::allocator<Character_*>_> *)this);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                               *)&character_1), bVar3) {
      ppCVar9 = __gnu_cxx::
                __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                ::operator*(&__end1_3);
      local_130 = *ppCVar9;
      (*(local_130->super_Command_Source)._vptr_Command_Source[2])(&local_150);
      PacketBuilder::AddBreakString((PacketBuilder *)&__range1_3,&local_150,0xff);
      std::__cxx11::string::~string((string *)&local_150);
      num = Character::PlayerID(local_130);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,num);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)local_130->mapid);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(uint)local_130->x);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(uint)local_130->y);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_130->direction);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,6);
      Character::PaddedGuildTag_abi_cxx11_((string *)&__range1_4,local_130);
      PacketBuilder::AddString((PacketBuilder *)&__range1_3,(string *)&__range1_4);
      std::__cxx11::string::~string((string *)&__range1_4);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_130->level);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_130->gender);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_130->hairstyle);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_130->haircolor);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_130->race);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,local_130->maxhp);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,local_130->hp);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,local_130->maxtp);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,local_130->tp);
      Character::AddPaperdollData(local_130,(PacketBuilder *)&__range1_3,"B000A0HSW");
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_130->sitting);
      bVar3 = Character::IsHideInvisible(local_130);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)bVar3);
      PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
      __gnu_cxx::
      __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
      operator++(&__end1_3);
    }
    this_00 = &updateitems.
               super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1_4 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin
                         ((vector<NPC_*,_std::allocator<NPC_*>_> *)this_00);
    npc_1 = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end
                             ((vector<NPC_*,_std::allocator<NPC_*>_> *)this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_4,
                              (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                               *)&npc_1), bVar3) {
      ppNVar10 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                 operator*(&__end1_4);
      pNVar2 = *ppNVar10;
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar2->index);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,pNVar2->id);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar2->x);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar2->y);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar2->direction);
      __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
                (&__end1_4);
    }
    PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
    __end1_5 = std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
               begin((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                      *)&__range1);
    item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::end
                   ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                     *)&__range1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_5,
                              (__normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
                               *)&item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount), bVar3) {
      psVar11 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
                ::operator*(&__end1_5);
      std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)local_1b8,psVar11);
      peVar12 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)peVar12->uid);
      peVar12 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
      PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)peVar12->id);
      peVar12 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)peVar12->x);
      peVar12 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
      PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)peVar12->y);
      peVar12 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
      PacketBuilder::AddThree((PacketBuilder *)&__range1_3,peVar12->amount);
      std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_1b8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
      ::operator++(&__end1_5);
    }
    Character::Send(character,(PacketBuilder *)&__range1_3);
    PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1_3);
    std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
              ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
               &__range1);
    std::vector<NPC_*,_std::allocator<NPC_*>_>::~vector
              ((vector<NPC_*,_std::allocator<NPC_*>_> *)
               &updateitems.
                super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<Character_*,_std::allocator<Character_*>_>::~vector
              ((vector<Character_*,_std::allocator<Character_*>_> *)
               &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void Warp_Accept(Character *character, PacketReader &reader)
{
	//int map = reader.GetShort();
	(void)reader;

	int anim = character->warp_anim;

	// Removed (character->mapid == map) check as it interferes with fallback maps

	if (anim != WARP_ANIMATION_INVALID)
	{
		character->warp_anim = WARP_ANIMATION_INVALID;
	}
	else
	{
		return;
	}

	std::vector<Character *> updatecharacters;
	std::vector<NPC *> updatenpcs;
	std::vector<std::shared_ptr<Map_Item>> updateitems;

	UTIL_FOREACH(character->map->characters, checkcharacter)
	{
		if (checkcharacter->InRange(character))
		{
			updatecharacters.push_back(checkcharacter);
		}
	}

	UTIL_FOREACH(character->map->npcs, npc)
	{
		if (character->InRange(npc) && npc->alive)
		{
			updatenpcs.push_back(npc);
		}
	}

	UTIL_FOREACH(character->map->items, item)
	{
		if (character->InRange(*item))
		{
			updateitems.push_back(item);
		}
	}

	PacketBuilder reply(PACKET_WARP, PACKET_AGREE,
		7 + updatecharacters.size() * 60 + updatenpcs.size() * 6 + updateitems.size() * 9);

	reply.AddChar(2); // ?
	reply.AddShort(character->mapid);
	reply.AddChar(anim);
	reply.AddChar(updatecharacters.size());
	reply.AddByte(255);
	UTIL_FOREACH(updatecharacters, character)
	{
		reply.AddBreakString(character->SourceName());
		reply.AddShort(character->PlayerID());
		reply.AddShort(character->mapid);
		reply.AddShort(character->x);
		reply.AddShort(character->y);
		reply.AddChar(character->direction);
		reply.AddChar(6); // ?
		reply.AddString(character->PaddedGuildTag());
		reply.AddChar(character->level);
		reply.AddChar(character->gender);
		reply.AddChar(character->hairstyle);
		reply.AddChar(character->haircolor);
		reply.AddChar(character->race);
		reply.AddShort(character->maxhp);
		reply.AddShort(character->hp);
		reply.AddShort(character->maxtp);
		reply.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(reply, "B000A0HSW");

		reply.AddChar(character->sitting);
		reply.AddChar(character->IsHideInvisible());
		reply.AddByte(255);
	}
	UTIL_FOREACH(updatenpcs, npc)
	{
		reply.AddChar(npc->index);
		reply.AddShort(npc->id);
		reply.AddChar(npc->x);
		reply.AddChar(npc->y);
		reply.AddChar(npc->direction);
	}
	reply.AddByte(255);
	UTIL_FOREACH(updateitems, item)
	{
		reply.AddShort(item->uid);
		reply.AddShort(item->id);
		reply.AddChar(item->x);
		reply.AddChar(item->y);
		reply.AddThree(item->amount);
	}
	character->Send(reply);
}